

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::fill_t<char>::operator=(fill_t<char> *this,basic_string_view<char> s)

{
  size_t sVar1;
  format_error *this_00;
  char *pcVar2;
  size_t local_40;
  size_t i;
  size_t size;
  fill_t<char> *this_local;
  basic_string_view<char> s_local;
  
  s_local.data_ = (char *)s.size_;
  this_local = (fill_t<char> *)s.data_;
  sVar1 = basic_string_view<char>::size((basic_string_view<char> *)&this_local);
  if (4 < sVar1) {
    this_00 = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this_00,"invalid fill");
    __cxa_throw(this_00,&format_error::typeinfo,format_error::~format_error);
  }
  for (local_40 = 0; local_40 < sVar1; local_40 = local_40 + 1) {
    pcVar2 = basic_string_view<char>::operator[]((basic_string_view<char> *)&this_local,local_40);
    this->data_[local_40] = *pcVar2;
  }
  this->size_ = (uchar)sVar1;
  return;
}

Assistant:

FMT_CONSTEXPR void operator=(basic_string_view<Char> s) {
    auto size = s.size();
    if (size > max_size) {
      FMT_THROW(format_error("invalid fill"));
      return;
    }
    for (size_t i = 0; i < size; ++i) data_[i] = s[i];
    size_ = static_cast<unsigned char>(size);
  }